

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.cpp
# Opt level: O3

void __thiscall Range::each(Range *this,function<void_(const_CylHead_&)> *func,bool cyls_first)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  undefined7 in_register_00000011;
  int head;
  int iVar9;
  undefined4 *puVar10;
  CylHead *pCVar11;
  uint uVar12;
  uint head_;
  undefined4 *puVar13;
  string sStack_80;
  function<void_(const_CylHead_&)> *pfStack_60;
  undefined4 *puStack_58;
  CylHead local_30;
  
  if ((int)CONCAT71(in_register_00000011,cyls_first) != 0) {
    iVar9 = this->head_begin;
    iVar6 = this->head_end;
    if (1 < iVar6 - iVar9) {
      if (iVar6 <= iVar9) {
        return;
      }
      iVar8 = this->cyl_end;
      do {
        uVar12 = this->cyl_begin;
        if ((int)uVar12 < iVar8) {
          do {
            puVar13 = (undefined4 *)(ulong)uVar12;
            puVar10 = puVar13;
            pCVar11 = &local_30;
            CylHead::CylHead(&local_30,uVar12,iVar9);
            if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0016567c;
            (*func->_M_invoker)((_Any_data *)func,&local_30);
            uVar12 = uVar12 + 1;
            iVar8 = this->cyl_end;
          } while ((int)uVar12 < iVar8);
          iVar6 = this->head_end;
        }
        iVar9 = iVar9 + 1;
        if (iVar6 <= iVar9) {
          return;
        }
      } while( true );
    }
  }
  uVar12 = this->cyl_begin;
  iVar9 = this->cyl_end;
  if ((int)uVar12 < iVar9) {
    iVar6 = this->head_end;
    do {
      head_ = this->head_begin;
      if ((int)head_ < iVar6) {
        do {
          puVar13 = (undefined4 *)(ulong)head_;
          puVar10 = (undefined4 *)(ulong)uVar12;
          pCVar11 = &local_30;
          CylHead::CylHead(&local_30,uVar12,head_);
          if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0016567c:
            std::__throw_bad_function_call();
            puVar10[1] = 4;
            pfStack_60 = func;
            puStack_58 = puVar13;
            if (pCVar11[0x1d].cyl == 0x534f4442) {
              *puVar10 = 2;
              if (*(char *)((long)&pCVar11[0x1a].cyl + 2) == '\0') {
                return;
              }
              paVar2 = &sStack_80.field_2;
              sStack_80.field_2._M_allocated_capacity = *(size_type *)((long)&pCVar11[0x1a].cyl + 2)
              ;
              sStack_80.field_2._8_2_ = *(undefined2 *)((long)&pCVar11[0x1b].cyl + 2);
              sStack_80._M_string_length = 10;
              sStack_80.field_2._M_local_buf[10] = '\0';
              psVar1 = (string *)(puVar10 + 2);
              sStack_80._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::operator=((string *)psVar1,(string *)&sStack_80);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)sStack_80._M_dataplus._M_p != paVar2) {
                operator_delete(sStack_80._M_dataplus._M_p,
                                sStack_80.field_2._M_allocated_capacity + 1);
              }
              sStack_80._M_string_length = 6;
              sStack_80.field_2._M_local_buf[6] = 0;
              sStack_80.field_2._M_allocated_capacity._0_6_ =
                   *(uint6 *)((long)&pCVar11[0x1f].cyl + 2);
              sStack_80._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_append((char *)psVar1,(ulong)paVar2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)sStack_80._M_dataplus._M_p != paVar2) {
                operator_delete(sStack_80._M_dataplus._M_p,
                                sStack_80.field_2._M_allocated_capacity + 1);
              }
              util::trim(&sStack_80,psVar1);
              std::__cxx11::string::operator=((string *)psVar1,(string *)&sStack_80);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)sStack_80._M_dataplus._M_p == paVar2) {
                return;
              }
            }
            else {
              cVar3 = *(char *)((long)&pCVar11[0x1a].cyl + 2);
              if ((cVar3 == -1) || (cVar3 == '\0')) {
                *puVar10 = 0;
                return;
              }
              *puVar10 = 1;
              bVar4 = *(byte *)((long)&pCVar11[0x1f].head + 3);
              bVar7 = 0x23;
              if (bVar4 < 0x23) {
                bVar7 = bVar4;
              }
              puVar10[1] = (uint)(byte)(bVar7 + 4);
              uVar5 = (ushort)pCVar11[0x1f].head;
              puVar10[10] = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
              if (*(char *)((long)&pCVar11[0x1a].cyl + 2) == '*') {
                return;
              }
              paVar2 = &sStack_80.field_2;
              sStack_80.field_2._M_allocated_capacity = *(size_type *)((long)&pCVar11[0x1a].cyl + 2)
              ;
              sStack_80.field_2._8_2_ = *(undefined2 *)((long)&pCVar11[0x1b].cyl + 2);
              sStack_80._M_string_length = 10;
              sStack_80.field_2._M_local_buf[10] = '\0';
              psVar1 = (string *)(puVar10 + 2);
              sStack_80._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::operator=((string *)psVar1,(string *)&sStack_80);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)sStack_80._M_dataplus._M_p != paVar2) {
                operator_delete(sStack_80._M_dataplus._M_p,
                                sStack_80.field_2._M_allocated_capacity + 1);
              }
              util::trim(&sStack_80,psVar1);
              std::__cxx11::string::operator=((string *)psVar1,(string *)&sStack_80);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)sStack_80._M_dataplus._M_p == paVar2) {
                return;
              }
            }
            operator_delete(sStack_80._M_dataplus._M_p,sStack_80.field_2._M_allocated_capacity + 1);
            return;
          }
          (*func->_M_invoker)((_Any_data *)func,&local_30);
          head_ = head_ + 1;
          iVar6 = this->head_end;
        } while ((int)head_ < iVar6);
        iVar9 = this->cyl_end;
      }
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < iVar9);
  }
  return;
}

Assistant:

void Range::each(const std::function<void(const CylHead & cylhead)>& func, bool cyls_first/*=false*/) const
{
    if (cyls_first && heads() > 1)
    {
        for (auto head = head_begin; head < head_end; ++head)
            for (auto cyl = cyl_begin; cyl < cyl_end; ++cyl)
                func(CylHead(cyl, head));
    }
    else
    {
        for (auto cyl = cyl_begin; cyl < cyl_end; ++cyl)
            for (auto head = head_begin; head < head_end; ++head)
                func(CylHead(cyl, head));
    }
}